

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

void * floor1_inverse1(vorbis_block *vb,vorbis_look_floor *in)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  uint local_9c;
  int local_84;
  int val;
  int room;
  int loroom;
  int hiroom;
  int predicted;
  int book;
  int cval;
  int csub;
  int csubbits;
  int cdim;
  int classv;
  int *fit_value;
  codebook *books;
  int local_40;
  int k;
  int j;
  int i;
  codec_setup_info *ci;
  vorbis_info_floor1 *info;
  vorbis_look_floor1 *look;
  vorbis_look_floor *in_local;
  vorbis_block *vb_local;
  
  piVar3 = *(int **)((long)in + 0x308);
  lVar9 = *(long *)((long)vb->vd->vi->codec_setup + 0x1428);
  lVar6 = oggpack_read(&vb->opb,1);
  if (lVar6 == 1) {
    vb_local = (vorbis_block *)_vorbis_block_alloc(vb,(long)*(int *)((long)in + 0x2fc) << 2);
    iVar4 = ilog(*(int *)((long)in + 0x304) - 1);
    lVar6 = oggpack_read(&vb->opb,iVar4);
    *(int *)&vb_local->pcm = (int)lVar6;
    iVar4 = ilog(*(int *)((long)in + 0x304) - 1);
    lVar6 = oggpack_read(&vb->opb,iVar4);
    *(int *)((long)&vb_local->pcm + 4) = (int)lVar6;
    local_40 = 2;
    for (k = 0; k < *piVar3; k = k + 1) {
      iVar4 = piVar3[(long)k + 1];
      iVar1 = piVar3[(long)iVar4 + 0x20];
      bVar7 = (byte)piVar3[(long)iVar4 + 0x30];
      predicted = 0;
      if (piVar3[(long)iVar4 + 0x30] != 0) {
        lVar6 = vorbis_book_decode((codebook *)(lVar9 + (long)piVar3[(long)iVar4 + 0x40] * 0x60),
                                   &vb->opb);
        predicted = (int)lVar6;
        if (predicted == -1) goto LAB_00134b57;
      }
      for (books._4_4_ = 0; books._4_4_ < iVar1; books._4_4_ = books._4_4_ + 1) {
        uVar8 = predicted & (1 << (bVar7 & 0x1f)) - 1U;
        predicted = predicted >> (bVar7 & 0x1f);
        if (piVar3[(long)iVar4 * 8 + (long)(int)uVar8 + 0x50] < 0) {
          *(undefined4 *)((long)&vb_local->pcm + (long)(local_40 + books._4_4_) * 4) = 0;
        }
        else {
          lVar6 = vorbis_book_decode((codebook *)
                                     (lVar9 + (long)piVar3[(long)iVar4 * 8 + (long)(int)uVar8 + 0x50
                                                          ] * 0x60),&vb->opb);
          *(int *)((long)&vb_local->pcm + (long)(local_40 + books._4_4_) * 4) = (int)lVar6;
          if ((int)lVar6 == -1) goto LAB_00134b57;
        }
      }
      local_40 = iVar1 + local_40;
    }
    for (k = 2; k < *(int *)((long)in + 0x2fc); k = k + 1) {
      uVar8 = render_point(piVar3[(long)*(int *)((long)in + (long)(k + -2) * 4 + 0x200) + 0xd1],
                           piVar3[(long)*(int *)((long)in + (long)(k + -2) * 4 + 0x104) + 0xd1],
                           *(int *)((long)&vb_local->pcm +
                                   (long)*(int *)((long)in + (long)(k + -2) * 4 + 0x200) * 4),
                           *(int *)((long)&vb_local->pcm +
                                   (long)*(int *)((long)in + (long)(k + -2) * 4 + 0x104) * 4),
                           piVar3[(long)k + 0xd1]);
      uVar5 = *(int *)((long)in + 0x304) - uVar8;
      local_9c = uVar8;
      if ((int)uVar5 < (int)uVar8) {
        local_9c = uVar5;
      }
      uVar2 = *(uint *)((long)&vb_local->pcm + (long)k * 4);
      if (uVar2 == 0) {
        *(uint *)((long)&vb_local->pcm + (long)k * 4) = uVar8 | 0x8000;
      }
      else {
        if ((int)uVar2 < (int)(local_9c << 1)) {
          if ((uVar2 & 1) == 0) {
            local_84 = (int)uVar2 >> 1;
          }
          else {
            local_84 = -((int)(uVar2 + 1) >> 1);
          }
        }
        else if ((int)uVar8 < (int)uVar5) {
          local_84 = uVar2 - uVar8;
        }
        else {
          local_84 = -1 - (uVar2 - uVar5);
        }
        *(uint *)((long)&vb_local->pcm + (long)k * 4) = local_84 + uVar8;
        lVar9 = (long)*(int *)((long)in + (long)(k + -2) * 4 + 0x200);
        *(uint *)((long)&vb_local->pcm + lVar9 * 4) =
             *(uint *)((long)&vb_local->pcm + lVar9 * 4) & 0x7fff;
        lVar9 = (long)*(int *)((long)in + (long)(k + -2) * 4 + 0x104);
        *(uint *)((long)&vb_local->pcm + lVar9 * 4) =
             *(uint *)((long)&vb_local->pcm + lVar9 * 4) & 0x7fff;
      }
    }
  }
  else {
LAB_00134b57:
    vb_local = (vorbis_block *)0x0;
  }
  return vb_local;
}

Assistant:

static void *floor1_inverse1(vorbis_block *vb,vorbis_look_floor *in){
  vorbis_look_floor1 *look=(vorbis_look_floor1 *)in;
  vorbis_info_floor1 *info=look->vi;
  codec_setup_info   *ci=(codec_setup_info *)vb->vd->vi->codec_setup;
  
  int i,j,k;
  codebook *books=ci->fullbooks;   
  
  /* unpack wrapped/predicted values from stream */
  if(oggpack_read(&vb->opb,1)==1){
    int *fit_value=(int *)_vorbis_block_alloc(vb,(look->posts)*sizeof(*fit_value));
    
    fit_value[0]=oggpack_read(&vb->opb,ilog(look->quant_q-1));
    fit_value[1]=oggpack_read(&vb->opb,ilog(look->quant_q-1));
    
    /* partition by partition */
    /* partition by partition */
    for(i=0,j=2;i<info->partitions;i++){
      int classv=info->partitionclass[i];
      int cdim=info->class_dim[classv];
      int csubbits=info->class_subs[classv];
      int csub=1<<csubbits;
      int cval=0;

      /* decode the partition's first stage cascade value */
      if(csubbits){
	cval=vorbis_book_decode(books+info->class_book[classv],&vb->opb);

	if(cval==-1)goto eop;
      }

      for(k=0;k<cdim;k++){
	int book=info->class_subbook[classv][cval&(csub-1)];
	cval>>=csubbits;
	if(book>=0){
	  if((fit_value[j+k]=vorbis_book_decode(books+book,&vb->opb))==-1)
	    goto eop;
	}else{
	  fit_value[j+k]=0;
	}
      }
      j+=cdim;
    }

    /* unwrap positive values and reconsitute via linear interpolation */
    for(i=2;i<look->posts;i++){
      int predicted=render_point(info->postlist[look->loneighbor[i-2]],
				 info->postlist[look->hineighbor[i-2]],
				 fit_value[look->loneighbor[i-2]],
				 fit_value[look->hineighbor[i-2]],
				 info->postlist[i]);
      int hiroom=look->quant_q-predicted;
      int loroom=predicted;
      int room=(hiroom<loroom?hiroom:loroom)<<1;
      int val=fit_value[i];

      if(val){
	if(val>=room){
	  if(hiroom>loroom){
	    val = val-loroom;
	  }else{
	  val = -1-(val-hiroom);
	  }
	}else{
	  if(val&1){
	    val= -((val+1)>>1);
	  }else{
	    val>>=1;
	  }
	}

	fit_value[i]=val+predicted;
	fit_value[look->loneighbor[i-2]]&=0x7fff;
	fit_value[look->hineighbor[i-2]]&=0x7fff;

      }else{
	fit_value[i]=predicted|0x8000;
      }
	
    }

    return(fit_value);
  }
 eop:
  return(NULL);
}